

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_msubs64_q(DisasContext_conflict14 *ctx,TCGv_i32 rl,TCGv_i32 rh,TCGv_i32 arg1_low,
                  TCGv_i32 arg1_high,TCGv_i32 arg2,TCGv_i32 arg3,uint32_t n)

{
  TCGTemp *ret;
  TCGContext_conflict9 *tcg_ctx;
  TCGv_i64 dest;
  TCGv_i32 pTVar1;
  uintptr_t o_1;
  uintptr_t o_2;
  uintptr_t o;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGv_i32 local_48;
  TCGv_i32 local_40;
  TCGTemp *local_38;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  dest = tcg_temp_new_i64(tcg_ctx);
  pTVar1 = tcg_const_i32_tricore(tcg_ctx,n);
  tcg_gen_concat_i32_i64_tricore(tcg_ctx,dest,arg1_low,arg1_high);
  local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  ret = (TCGTemp *)(dest + (long)&tcg_ctx->pool_cur);
  local_48 = arg2 + (long)tcg_ctx;
  local_40 = arg3 + (long)tcg_ctx;
  local_50 = ret;
  local_38 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  tcg_gen_callN_tricore(tcg_ctx,helper_msub64_q_ssov,ret,5,&local_58);
  tcg_gen_extr_i64_i32_tricore(tcg_ctx,rl,rh,dest);
  tcg_temp_free_internal_tricore(tcg_ctx,ret);
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return;
}

Assistant:

static inline void
gen_msubs64_q(DisasContext *ctx, TCGv rl, TCGv rh, TCGv arg1_low, TCGv arg1_high, TCGv arg2,
             TCGv arg3, uint32_t n)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv_i64 r1 = tcg_temp_new_i64(tcg_ctx);
    TCGv temp = tcg_const_i32(tcg_ctx, n);

    tcg_gen_concat_i32_i64(tcg_ctx, r1, arg1_low, arg1_high);
    gen_helper_msub64_q_ssov(tcg_ctx, r1, tcg_ctx->cpu_env, r1, arg2, arg3, temp);
    tcg_gen_extr_i64_i32(tcg_ctx, rl, rh, r1);

    tcg_temp_free_i64(tcg_ctx, r1);
    tcg_temp_free(tcg_ctx, temp);
}